

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_prediction_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_369d94::
DrPredTest<unsigned_char,_void_(*)(unsigned_char_*,_long,_int,_int,_const_unsigned_char_*,_const_unsigned_char_*,_int,_int,_int,_int,_int)>
::RundrPredTest(DrPredTest<unsigned_char,_void_(*)(unsigned_char_*,_long,_int,_int,_const_unsigned_char_*,_const_unsigned_char_*,_int,_int,_int,_int,_int)>
                *this,int speed)

{
  int iVar1;
  int in_ESI;
  long in_RDI;
  int angle;
  int i;
  int stop_angle;
  int start_angle;
  int angles [3];
  int in_stack_00000288;
  undefined1 in_stack_0000028e;
  undefined1 in_stack_0000028f;
  DrPredTest<unsigned_char,_void_(*)(unsigned_char_*,_long,_int,_int,_const_unsigned_char_*,_const_unsigned_char_*,_int,_int,_int,_int,_int)>
  *in_stack_00000290;
  uint local_3c;
  int local_38;
  uint local_34;
  uint local_24;
  int local_18 [6];
  
  if (*(long *)(in_RDI + 0x50) != 0) {
    local_18[0] = 3;
    local_18[1] = 0x2d;
    local_18[2] = 0x57;
    if (in_ESI == 0) {
      local_34 = *(uint *)(in_RDI + 0x3c);
      local_38 = *(int *)(in_RDI + 0x40);
    }
    else {
      local_34 = 0;
      local_38 = 3;
    }
    *(undefined4 *)(in_RDI + 0x18) = 0;
    local_18[3] = in_ESI;
    while (local_24 = local_34, *(int *)(in_RDI + 0x18) < 2) {
      for (; (int)local_24 < local_38; local_24 = local_24 + 1) {
        if (local_18[3] == 0) {
          local_3c = local_24;
        }
        else {
          local_3c = local_18[(int)local_24] + *(int *)(in_RDI + 0x3c);
        }
        iVar1 = av1_get_dx(local_3c);
        *(int *)(in_RDI + 0x2c) = iVar1;
        iVar1 = av1_get_dy(local_3c);
        *(int *)(in_RDI + 0x30) = iVar1;
        if (local_18[3] != 0) {
          printf("enable_upsample: %d angle: %d ~~~~~~~~~~~~~~~\n",(ulong)*(uint *)(in_RDI + 0x18),
                 (ulong)local_3c);
        }
        if ((*(int *)(in_RDI + 0x2c) != 0) && (*(int *)(in_RDI + 0x30) != 0)) {
          RunTest(in_stack_00000290,(bool)in_stack_0000028f,(bool)in_stack_0000028e,
                  in_stack_00000288);
        }
      }
      *(int *)(in_RDI + 0x18) = *(int *)(in_RDI + 0x18) + 1;
    }
  }
  return;
}

Assistant:

void RundrPredTest(const int speed) {
    if (params_.tst_fn == nullptr) return;
    const int angles[] = { 3, 45, 87 };
    const int start_angle = speed ? 0 : start_angle_;
    const int stop_angle = speed ? 3 : stop_angle_;
    for (enable_upsample_ = 0; enable_upsample_ < 2; ++enable_upsample_) {
      for (int i = start_angle; i < stop_angle; ++i) {
        const int angle = speed ? angles[i] + start_angle_ : i;
        dx_ = av1_get_dx(angle);
        dy_ = av1_get_dy(angle);
        if (speed) {
          printf("enable_upsample: %d angle: %d ~~~~~~~~~~~~~~~\n",
                 enable_upsample_, angle);
        }
        if (dx_ && dy_) RunTest(speed, false, angle);
      }
    }
  }